

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolver.cpp
# Opt level: O1

void __thiscall
chrono::ChIterativeSolver::SaveMatrix(ChIterativeSolver *this,ChSystemDescriptor *sysd)

{
  ChStreamOutAscii *this_00;
  _func_int **pp_Var1;
  Index rows;
  double *pdVar2;
  undefined8 *puVar3;
  Index size;
  char *__function;
  long lVar4;
  long lVar5;
  long lVar6;
  Index othersize;
  ChVectorDynamic<> e;
  ChVectorDynamic<> v;
  ChMatrixDynamic<> Z2;
  ChVectorDynamic<> rhs2;
  ChVectorDynamic<> rhs1;
  ChSparseMatrix Z1;
  ChStreamOutAsciiFile file;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_408;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3f8;
  DenseStorage<double,__1,__1,__1,_1> local_3e8;
  long local_3c8;
  long lStack_3c0;
  long local_3b8;
  long lStack_3b0;
  long lStack_3a8;
  long lStack_3a0;
  undefined1 local_390 [16];
  undefined8 local_380;
  _func_int **local_378;
  SparseMatrix<double,_1,_int> local_370;
  ChStreamOutAsciiFile local_320;
  
  local_370.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)false;
  local_370._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
  local_370.m_outerSize = 0xffffffffffffffff;
  local_370.m_innerSize = 0;
  local_370.m_outerIndex = (StorageIndex *)0x0;
  local_370.m_innerNonZeros = (StorageIndex *)0x0;
  local_370.m_data.m_values = (Scalar *)0x0;
  local_370.m_data.m_indices = (StorageIndex *)0x0;
  local_370.m_data.m_size = 0;
  local_370.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_1,_int>::resize(&local_370,0,0);
  (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&local_370,0);
  local_3e8.m_data = (double *)0x0;
  local_3e8.m_rows = 0;
  local_3e8.m_cols = 0;
  if ((local_370.m_innerSize | local_370.m_outerSize) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  if ((local_370.m_innerSize != 0 && local_370.m_outerSize != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_370.m_innerSize),0)
      < local_370.m_outerSize)) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = std::ostream::_M_insert<bool>;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            (&local_3e8,local_370.m_innerSize * local_370.m_outerSize,local_370.m_outerSize,
             local_370.m_innerSize);
  rows = local_370.m_innerSize;
  if (local_370.m_innerSize < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  local_408.m_storage.m_data = (double *)0x0;
  local_408.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_408,local_370.m_innerSize,1);
  if (local_408.m_storage.m_rows != rows) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_408,rows,1);
  }
  if (local_408.m_storage.m_rows != rows) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
                 );
  }
  if (0 < local_408.m_storage.m_rows) {
    memset(local_408.m_storage.m_data,0,local_408.m_storage.m_rows << 3);
  }
  local_378 = (_func_int **)&PTR_SetElement_00b34038;
  local_3f8.m_storage.m_data = (double *)0x0;
  local_3f8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_3f8,local_370.m_innerSize);
  if (0 < local_370.m_innerSize) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      if (local_408.m_storage.m_rows <= lVar6) {
LAB_007ca073:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      local_408.m_storage.m_data[lVar6] = 1.0;
      (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&local_3f8,&local_408);
      if (local_3e8.m_rows < 0 && local_3e8.m_data != (double *)0x0) {
        __function = 
        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
        ;
        goto LAB_007ca0e5;
      }
      if (local_3e8.m_cols <= lVar6) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      if (local_3e8.m_rows != local_3f8.m_storage.m_rows) {
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>]"
                     );
      }
      if (0 < local_3e8.m_rows) {
        pdVar2 = (double *)((long)local_3e8.m_data + lVar5);
        lVar4 = 0;
        do {
          *pdVar2 = local_3f8.m_storage.m_data[lVar4];
          lVar4 = lVar4 + 1;
          pdVar2 = pdVar2 + local_3e8.m_cols;
        } while (local_3e8.m_rows != lVar4);
      }
      if (local_408.m_storage.m_rows <= lVar6) goto LAB_007ca073;
      local_408.m_storage.m_data[lVar6] = 0.0;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 8;
    } while (lVar6 < local_370.m_innerSize);
  }
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&local_320,"Z1.dat",_S_trunc);
  builtin_strncpy(local_320.super_ChStreamOutAscii.number_format,"%.12g",6);
  StreamOUTsparseMatlabFormat(&local_370,&local_320.super_ChStreamOutAscii);
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&local_320);
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&local_320,"Z2.dat",_S_trunc);
  builtin_strncpy(local_320.super_ChStreamOutAscii.number_format,"%.12g",6);
  local_3b8 = 0;
  lStack_3b0 = 0;
  lStack_3a8 = 0;
  lStack_3a0 = 0;
  local_390 = ZEXT416(0) << 0x40;
  local_380 = 0;
  Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
  construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_3b8,
             &local_3e8);
  if (0 < lStack_3b0) {
    this_00 = &local_320.super_ChStreamOutAscii;
    lVar6 = 0;
    lVar5 = 0;
    do {
      if (0 < lStack_3a8) {
        lVar4 = 0;
        do {
          if (lStack_3b0 <= lVar5) goto LAB_007ca054;
          ChStreamOutAscii::operator<<
                    (this_00,*(double *)(lStack_3a0 * lVar6 + local_3b8 + lVar4 * 8));
          if (lVar4 < lStack_3a8 + -1) {
            ChStreamOutAscii::operator<<(this_00," ");
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < lStack_3a8);
      }
      ChStreamOutAscii::operator<<(this_00,"\n");
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 8;
    } while (lVar5 < lStack_3b0);
  }
  if (local_390._0_8_ != 0) {
    free(*(void **)(local_390._0_8_ + -8));
  }
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&local_320);
  local_3b8 = 0;
  lStack_3b0 = 0;
  (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,0);
  local_3c8 = 0;
  lStack_3c0 = 0;
  (*sysd->_vptr_ChSystemDescriptor[0xe])(sysd);
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&local_320,"rhs1.dat",_S_trunc);
  lVar6 = lStack_3b0;
  lVar5 = local_3b8;
  builtin_strncpy(local_320.super_ChStreamOutAscii.number_format,"%.12g",6);
  if (-1 < lStack_3b0 || local_3b8 == 0) {
    if (0 < lStack_3b0) {
      lVar4 = 0;
      do {
        if (lVar6 <= lVar4) goto LAB_007ca054;
        ChStreamOutAscii::operator<<
                  (&local_320.super_ChStreamOutAscii,*(double *)(lVar5 + lVar4 * 8));
        ChStreamOutAscii::operator<<(&local_320.super_ChStreamOutAscii,"\n");
        lVar4 = lVar4 + 1;
      } while (lVar6 != lVar4);
    }
    ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&local_320);
    ChStreamOutAsciiFile::ChStreamOutAsciiFile(&local_320,"rhs2.dat",_S_trunc);
    lVar6 = lStack_3c0;
    lVar5 = local_3c8;
    builtin_strncpy(local_320.super_ChStreamOutAscii.number_format,"%.12g",6);
    if (-1 < lStack_3c0 || local_3c8 == 0) {
      if (0 < lStack_3c0) {
        lVar4 = 0;
        do {
          if (lVar6 <= lVar4) {
LAB_007ca054:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, 0>::operator()(Index, Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                         );
          }
          ChStreamOutAscii::operator<<
                    (&local_320.super_ChStreamOutAscii,*(double *)(lVar5 + lVar4 * 8));
          ChStreamOutAscii::operator<<(&local_320.super_ChStreamOutAscii,"\n");
          lVar4 = lVar4 + 1;
        } while (lVar6 != lVar4);
      }
      ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&local_320);
      if (local_3c8 != 0) {
        free(*(void **)(local_3c8 + -8));
      }
      pp_Var1 = local_378;
      if (local_3b8 != 0) {
        free(*(void **)(local_3b8 + -8));
      }
      if (local_3f8.m_storage.m_data != (double *)0x0) {
        free((void *)local_3f8.m_storage.m_data[-1]);
      }
      if (local_408.m_storage.m_data != (double *)0x0) {
        free((void *)local_408.m_storage.m_data[-1]);
      }
      if (local_3e8.m_data != (double *)0x0) {
        free((void *)local_3e8.m_data[-1]);
      }
      local_370._vptr_SparseMatrix = pp_Var1;
      free(local_370.m_outerIndex);
      free(local_370.m_innerNonZeros);
      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_370.m_data);
      return;
    }
  }
  builtin_strncpy(local_320.super_ChStreamOutAscii.number_format,"%.12g",6);
  __function = 
  "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
  ;
LAB_007ca0e5:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,__function);
}

Assistant:

void ChIterativeSolver::SaveMatrix(ChSystemDescriptor& sysd) {
    // Assemble sparse matrix
    ChSparseMatrix Z1;
    sysd.ConvertToMatrixForm(&Z1, nullptr);

    // Create sparse matrix with SPMV
    ChMatrixDynamic<> Z2(Z1.rows(), Z1.cols());
    ChVectorDynamic<> e = ChVectorDynamic<>::Zero(Z1.cols());
    ChVectorDynamic<> v(Z1.cols());
    for (int i = 0; i < Z1.cols(); i++) {
        e(i) = 1;
        sysd.SystemProduct(v, e);
        Z2.col(i) = v;
        e(i) = 0;
    }

    // Save matrices to file
    {
        ChStreamOutAsciiFile file("Z1.dat");
        file.SetNumFormat("%.12g");
        StreamOUTsparseMatlabFormat(Z1, file);
    }
    {
        ChStreamOutAsciiFile file("Z2.dat");
        file.SetNumFormat("%.12g");
        StreamOUTdenseMatlabFormat(Z2, file);
    }

    // Assemble RHS
    ChVectorDynamic<> rhs1;
    sysd.ConvertToMatrixForm(nullptr, &rhs1);

    // RHS using d vector
    ChVectorDynamic<> rhs2;
    sysd.BuildDiVector(rhs2);

    // Save vectors to file
    {
        ChStreamOutAsciiFile file("rhs1.dat");
        file.SetNumFormat("%.12g");
        StreamOUTdenseMatlabFormat(rhs1, file);
    }
    {
        ChStreamOutAsciiFile file("rhs2.dat");
        file.SetNumFormat("%.12g");
        StreamOUTdenseMatlabFormat(rhs2, file);
    }
}